

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

void __thiscall cmCustomCommandGenerator::~cmCustomCommandGenerator(cmCustomCommandGenerator *this)

{
  cmGeneratorExpression *this_00;
  
  this_00 = this->GE;
  if (this_00 != (cmGeneratorExpression *)0x0) {
    cmGeneratorExpression::~cmGeneratorExpression(this_00);
  }
  operator_delete(this_00,0x10);
  std::__cxx11::string::~string((string *)&this->WorkingDirectory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Depends);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&this->EmulatorsWithArguments);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&(this->CommandLines).
              super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  std::__cxx11::string::~string((string *)&this->Config);
  return;
}

Assistant:

cmCustomCommandGenerator::~cmCustomCommandGenerator()
{
  delete this->GE;
}